

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O1

void __thiscall
libDAI::Box::Box(Box *this,VarSet *ns,
                vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *points)

{
  Prob *a;
  Prob *a_00;
  pointer pTVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  allocator_type local_59;
  Box *local_58;
  TProb<double> local_50;
  double local_38;
  
  auVar4 = in_ZMM1._0_16_;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector
            ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)this,&ns->_vars);
  (this->_vars)._statespace = ns->_statespace;
  a = &this->_min;
  a_00 = &this->_max;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_min)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_max)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (points->
           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((points->super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish == pTVar1) {
    auVar4 = vcvtusi2sd_avx512f(auVar4,ns->_statespace);
    local_58 = (Box *)(1.0 / auVar4._0_8_);
    local_38 = (double)local_58;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50._p,ns->_statespace,&local_38,&local_59);
    if (a != &local_50) {
      std::vector<double,_std::allocator<double>_>::operator=(&a->_p,&local_50._p);
    }
    if (local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_38 = (double)local_58;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50._p,ns->_statespace,&local_38,&local_59);
    if (a_00 != &local_50) {
      std::vector<double,_std::allocator<double>_>::operator=(&a_00->_p,&local_50._p);
    }
    if (local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    local_58 = this;
    if (a_00 != pTVar1) {
      std::vector<double,_std::allocator<double>_>::operator=(&a_00->_p,&pTVar1->_p);
    }
    std::vector<double,_std::allocator<double>_>::operator=(&a->_p,&a_00->_p);
    pTVar1 = (points->
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(points->
                           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) *
                   -0x5555555555555555)) {
      uVar2 = 1;
      lVar3 = 0x18;
      do {
        min<double>(&local_50,a,
                    (TProb<double> *)
                    ((long)&(pTVar1->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    + lVar3));
        if (a != &local_50) {
          std::vector<double,_std::allocator<double>_>::operator=(&a->_p,&local_50._p);
        }
        if (local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        max<double>(&local_50,a_00,
                    (TProb<double> *)
                    ((long)&(((points->
                              super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_p).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl + lVar3));
        if (a_00 != &local_50) {
          std::vector<double,_std::allocator<double>_>::operator=(&a_00->_p,&local_50._p);
        }
        if (local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar2 = uVar2 + 1;
        pTVar1 = (points->
                 super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + 0x18;
      } while (uVar2 < (ulong)(((long)(points->
                                      super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >>
                               3) * -0x5555555555555555));
    }
  }
  return;
}

Assistant:

Box(const VarSet &ns, const std::vector<Prob> &points) : _vars(ns) {
                if( points.size() == 0 ) {
                    double x = 1.0 / ns.stateSpace();
                    _min = Prob(ns.stateSpace(), x);
                    _max = Prob(ns.stateSpace(), x);
                } else {
                    size_t N = ns.stateSpace();
                    assert( points[0].size() == N );
                    _min = _max = points[0];
                    for( size_t i = 1; i < points.size(); i++ ) {
                        assert( points[i].size() == N );
                        _min = libDAI::min( _min, points[i] );
                        _max = libDAI::max( _max, points[i] );
                    }
                }
            }